

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

secp256k1_context * secp256k1_context_create(uint flags)

{
  void *prealloc;
  secp256k1_context *psVar1;
  secp256k1_context *ctx;
  size_t prealloc_size;
  uint in_stack_0000002c;
  size_t in_stack_ffffffffffffffd8;
  secp256k1_callback *in_stack_ffffffffffffffe0;
  secp256k1_context *local_8;
  
  prealloc = (void *)secp256k1_context_preallocated_size(in_stack_0000002c);
  local_8 = (secp256k1_context *)checked_malloc(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8)
  ;
  psVar1 = secp256k1_context_preallocated_create(prealloc,(uint)((ulong)local_8 >> 0x20));
  if (psVar1 == (secp256k1_context *)0x0) {
    free(local_8);
    local_8 = (secp256k1_context *)0x0;
  }
  return local_8;
}

Assistant:

secp256k1_context* secp256k1_context_create(unsigned int flags) {
    size_t const prealloc_size = secp256k1_context_preallocated_size(flags);
    secp256k1_context* ctx = (secp256k1_context*)checked_malloc(&default_error_callback, prealloc_size);
    if (EXPECT(secp256k1_context_preallocated_create(ctx, flags) == NULL, 0)) {
        free(ctx);
        return NULL;
    }

    return ctx;
}